

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_result
drwav__read_chunk_header
          (drwav_read_proc onRead,void *pUserData,drwav_container container,
          drwav_uint64 *pRunningBytesReadOut,drwav_chunk_header *pHeaderOut)

{
  uint uVar1;
  long lVar2;
  long *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  code *in_RDI;
  long in_R8;
  drwav_uint8 sizeInBytes_1 [8];
  drwav_uint8 sizeInBytes [4];
  long local_4c;
  uint local_44;
  long local_40;
  long *local_38;
  undefined8 local_28;
  code *local_20;
  uint *local_10;
  long *local_8;
  
  local_40 = in_R8;
  local_38 = in_RCX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  if ((in_EDX == 0) || (in_EDX == 2)) {
    lVar2 = (*in_RDI)(in_RSI,in_R8,4);
    if (lVar2 != 4) {
      return -0x35;
    }
    lVar2 = (*local_20)(local_28,&local_44,4);
    if (lVar2 != 4) {
      return -10;
    }
    local_10 = &local_44;
    *(ulong *)(local_40 + 0x10) = (ulong)local_44;
    uVar1 = drwav__chunk_padding_size_riff(*(drwav_uint64 *)(local_40 + 0x10));
    *(uint *)(local_40 + 0x18) = uVar1;
    *local_38 = *local_38 + 8;
  }
  else {
    lVar2 = (*in_RDI)(in_RSI,in_R8,0x10);
    if (lVar2 != 0x10) {
      return -0x35;
    }
    lVar2 = (*local_20)(local_28,&local_4c,8);
    if (lVar2 != 8) {
      return -10;
    }
    local_8 = &local_4c;
    *(long *)(local_40 + 0x10) = local_4c + -0x18;
    uVar1 = drwav__chunk_padding_size_w64(*(drwav_uint64 *)(local_40 + 0x10));
    *(uint *)(local_40 + 0x18) = uVar1;
    *local_38 = *local_38 + 0x18;
  }
  return 0;
}

Assistant:

static drwav_result drwav__read_chunk_header(drwav_read_proc onRead, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_chunk_header* pHeaderOut)
{
    if (container == drwav_container_riff || container == drwav_container_rf64) {
        drwav_uint8 sizeInBytes[4];

        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav__bytes_to_u32(sizeInBytes);
        pHeaderOut->paddingSize = drwav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 8;
    } else {
        drwav_uint8 sizeInBytes[8];

        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav__bytes_to_u64(sizeInBytes) - 24;    /* <-- Subtract 24 because w64 includes the size of the header. */
        pHeaderOut->paddingSize = drwav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    }

    return DRWAV_SUCCESS;
}